

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O3

void print_learned_mocks(void)

{
  uint in_EAX;
  int iVar1;
  int iVar2;
  int iVar3;
  TestReporter *pTVar4;
  undefined8 *puVar5;
  void *pvVar6;
  int i;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  pTVar4 = get_test_reporter();
  walk_breadcrumb(pTVar4->breadcrumb,show_breadcrumb,(void *)((long)&uStack_38 + 4));
  __fprintf_chk(_stderr,1,": Learned mocks are\n");
  iVar1 = cgreen_vector_size(learned_mock_calls);
  if (iVar1 == 0) {
    __fprintf_chk(_stderr,1,"\t<none>\n");
  }
  else {
    iVar1 = cgreen_vector_size(learned_mock_calls);
    if (0 < iVar1) {
      iVar1 = 0;
      do {
        puVar5 = (undefined8 *)cgreen_vector_get(learned_mock_calls,iVar1);
        __fprintf_chk(_stderr,1,"\texpect(%s",*puVar5);
        iVar2 = cgreen_vector_size((CgreenVector *)puVar5[3]);
        if (0 < iVar2) {
          iVar2 = 0;
          do {
            pvVar6 = cgreen_vector_get((CgreenVector *)puVar5[3],iVar2);
            if (*(int *)((long)pvVar6 + 0x40) == 2) {
              __fprintf_chk(*(undefined8 *)((long)pvVar6 + 0x48),_stderr,1,
                            ", when(%s, is_equal_to_double(%f))",
                            *(undefined8 *)((long)pvVar6 + 0x58));
            }
            else {
              __fprintf_chk(_stderr,1,", when(%s, is_equal_to(%ld))",
                            *(undefined8 *)((long)pvVar6 + 0x58),
                            *(undefined8 *)((long)pvVar6 + 0x48));
            }
            iVar2 = iVar2 + 1;
            iVar3 = cgreen_vector_size((CgreenVector *)puVar5[3]);
          } while (iVar2 < iVar3);
        }
        __fprintf_chk(_stderr,1,");\n");
        iVar1 = iVar1 + 1;
        iVar2 = cgreen_vector_size(learned_mock_calls);
      } while (iVar1 < iVar2);
    }
  }
  return;
}

Assistant:

void print_learned_mocks(void) {
    int e, c, i = 0;
    CgreenBreadcrumb *breadcrumb = get_test_reporter()->breadcrumb;

    walk_breadcrumb(breadcrumb, &show_breadcrumb, (void *) &i);

    fprintf(stderr, ": Learned mocks are\n");

    if (cgreen_vector_size(learned_mock_calls) == 0) {
        fprintf(stderr, "\t<none>\n");
        return;
    }

    for (e = 0; e < cgreen_vector_size(learned_mock_calls); e++) {
        RecordedExpectation *expectation = (RecordedExpectation*)cgreen_vector_get(learned_mock_calls, e);
        const char *function_name = expectation->function;
        fprintf(stderr, "\texpect(%s", function_name);
        for (c = 0; c < cgreen_vector_size(expectation->constraints); c++) {
            Constraint *constraint = (Constraint *)cgreen_vector_get(expectation->constraints, c);
            if (constraint->expected_value.type == CGREEN_DOUBLE)
                fprintf(stderr, ", when(%s, is_equal_to_double(%f))", constraint->expected_value_name,
                        constraint->expected_value.value.double_value);
            else
                fprintf(stderr, ", when(%s, is_equal_to(%" PRIdPTR "))", constraint->expected_value_name,
                        constraint->expected_value.value.integer_value);
        }
        fprintf(stderr, ");\n");
    }
}